

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

shared_ptr<kratos::FinalStmtBlock> __thiscall kratos::Generator::final(Generator *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Generator *in_RSI;
  shared_ptr<kratos::FinalStmtBlock> sVar1;
  shared_ptr<kratos::Stmt> local_30;
  undefined1 local_19;
  Generator *this_local;
  shared_ptr<kratos::FinalStmtBlock> *stmt;
  
  local_19 = 0;
  this_local = this;
  std::make_shared<kratos::FinalStmtBlock>();
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::FinalStmtBlock,void>
            (&local_30,(shared_ptr<kratos::FinalStmtBlock> *)this);
  add_stmt(in_RSI,&local_30);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_30);
  sVar1.super___shared_ptr<kratos::FinalStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::FinalStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::FinalStmtBlock>)
         sVar1.super___shared_ptr<kratos::FinalStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FinalStmtBlock> Generator::final() {
    auto stmt = std::make_shared<FinalStmtBlock>();
    add_stmt(stmt);
    return stmt;
}